

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  __m128i *palVar9;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong size;
  int iVar16;
  long lVar17;
  long lVar18;
  char *__format;
  ulong uVar19;
  long lVar20;
  long lVar21;
  __m128i *ptr_02;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  longlong lVar25;
  __m128i_64_t B;
  undefined1 auVar26 [16];
  undefined1 extraout_XMM0 [16];
  longlong lVar27;
  undefined1 extraout_XMM0_00 [16];
  int64_t iVar28;
  __m128i_64_t B_4;
  longlong lVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar47;
  undefined1 auVar45 [16];
  int iVar57;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar63;
  int iVar64;
  undefined1 auVar58 [16];
  int iVar65;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong uVar72;
  undefined1 auVar73 [16];
  __m128i_64_t B_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i a;
  __m128i a_00;
  __m128i b;
  __m128i b_00;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  long local_138;
  int iStack_110;
  uint local_108;
  int iStack_104;
  uint uStack_100;
  int iStack_fc;
  uint local_f0;
  int iStack_ec;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar7 = profile->s1Len;
        if ((int)uVar7 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else {
          uVar22 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar15 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "open";
          }
          else {
            if (-1 < gap) {
              uVar23 = uVar7 - 1;
              size = (ulong)uVar7 + 1 >> 1;
              uVar13 = (ulong)(uint)open;
              iVar16 = -open;
              iVar12 = ppVar3->min;
              uVar24 = 0x8000000000000000 - (long)iVar12;
              if (iVar12 != iVar16 && SBORROW4(iVar12,iVar16) == iVar12 + open < 0) {
                uVar24 = uVar13 | 0x8000000000000000;
              }
              iVar12 = ppVar3->max;
              ppVar8 = parasail_result_new_table1((uint)((ulong)uVar7 + 1) & 0x7ffffffe,s2Len);
              if (ppVar8 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar8->flag = ppVar8->flag | 0x2820801;
              palVar9 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              auVar41._0_4_ = -(uint)((int)((ulong)palVar9 >> 0x20) == 0 && (int)palVar9 == 0);
              auVar41._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar41._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar41._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar6 = movmskps((int)ptr_01,auVar41);
              if (iVar6 != 0) {
                return (parasail_result_t *)0x0;
              }
              iVar6 = s2Len + -1;
              uVar7 = 1 - (int)(uVar23 / size);
              uVar72 = (ulong)(uint)gap;
              lVar10 = uVar24 + 1;
              lVar17 = 0x7ffffffffffffffe - (long)iVar12;
              auVar26._8_4_ = (int)lVar10;
              auVar26._0_8_ = lVar10;
              auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar51._8_4_ = (int)lVar17;
              auVar51._0_8_ = lVar17;
              auVar51._12_4_ = (int)((ulong)lVar17 >> 0x20);
              uVar11 = (ulong)(uint)gap;
              lVar17 = (long)iVar16;
              lVar18 = size * uVar11;
              lVar10 = lVar17;
              for (uVar19 = 0; uVar19 != size; uVar19 = uVar19 + 1) {
                lVar20 = lVar10;
                for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
                  *(long *)((long)&h + lVar21 * 8) = lVar20;
                  *(ulong *)((long)&e + lVar21 * 8) = lVar20 - uVar13;
                  lVar20 = lVar20 - lVar18;
                }
                palVar9[uVar19][0] = h.m[0];
                palVar9[uVar19][1] = h.m[1];
                ptr_00[uVar19][0] = e.m[0];
                ptr_00[uVar19][1] = e.m[1];
                lVar10 = lVar10 - uVar11;
              }
              *ptr_01 = 0;
              for (uVar19 = 1; s2Len + 1 != uVar19; uVar19 = uVar19 + 1) {
                ptr_01[uVar19] = lVar17;
                lVar17 = lVar17 - uVar11;
              }
              lVar10 = size * uVar22 * 4;
              local_138 = 0;
              uVar11 = 0;
              auVar41 = _DAT_008a1890;
              do {
                ptr_02 = palVar9;
                if (uVar11 == uVar22) {
                  b_00[0] = (ulong)uVar7;
                  iVar12 = 0;
                  lVar33 = ptr_02[(ulong)uVar23 % size][0];
                  lVar27 = ptr_02[(ulong)uVar23 % size][1];
                  while (lVar25 = lVar33, iVar12 < (int)uVar7) {
                    lVar33 = 0;
                    lVar27 = lVar25;
                    iVar12 = 1;
                  }
                  local_f0 = (uint)uVar24;
                  iStack_ec = (int)(uVar24 >> 0x20);
                  a_00[1] = lVar18;
                  a_00[0] = (longlong)ppVar8;
                  b_00[1] = 1;
                  _mm_cmpgt_epi64_rpl(a_00,b_00);
                  local_108 = auVar51._0_4_;
                  iStack_104 = auVar51._4_4_;
                  uStack_100 = auVar51._8_4_;
                  iStack_fc = auVar51._12_4_;
                  iVar12 = -(uint)((int)(local_f0 ^ 0x80000000) < (int)(local_108 ^ 0x80000000));
                  auVar37._4_4_ = -(uint)(iStack_ec < iStack_104);
                  iVar16 = -(uint)((int)(local_f0 ^ 0x80000000) < (int)(uStack_100 ^ 0x80000000));
                  auVar37._12_4_ = -(uint)(iStack_ec < iStack_fc);
                  auVar42._4_4_ = iVar12;
                  auVar42._0_4_ = iVar12;
                  auVar42._8_4_ = iVar16;
                  auVar42._12_4_ = iVar16;
                  auVar44._4_4_ = -(uint)(iStack_ec == iStack_104);
                  auVar44._12_4_ = -(uint)(iStack_ec == iStack_fc);
                  auVar44._0_4_ = auVar44._4_4_;
                  auVar44._8_4_ = auVar44._12_4_;
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  auVar34._8_4_ = 0xffffffff;
                  auVar34._0_8_ = 0xffffffffffffffff;
                  auVar34._12_4_ = 0xffffffff;
                  auVar41 = auVar34 ^ (auVar37 | auVar44 & auVar42) | extraout_XMM0_00;
                  if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar41 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar41 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar41 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar41[0xf]) {
                    iStack_110 = (int)lVar27;
                  }
                  else {
                    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                    iStack_110 = 0;
                    iVar6 = 0;
                    uVar23 = 0;
                  }
                  ppVar8->score = iStack_110;
                  ppVar8->end_query = uVar23;
                  ppVar8->end_ref = iVar6;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar8;
                }
                iVar12 = ppVar3->mapper[(byte)s2[uVar11]];
                iVar28 = ptr_01[uVar11];
                lVar33 = ptr_02[(int)size - 1][0];
                lVar17 = local_138;
                auVar75 = auVar26;
                for (lVar20 = 0; uVar19 = (ulong)(uint)gap, size * 0x10 != lVar20;
                    lVar20 = lVar20 + 0x10) {
                  plVar1 = (long *)((long)pvVar2 + lVar20 + (long)(iVar12 * (int)size) * 0x10);
                  auVar29._0_8_ = iVar28 + *plVar1;
                  auVar29._8_8_ = lVar33 + plVar1[1];
                  auVar37 = *(undefined1 (*) [16])((long)*ptr_00 + lVar20);
                  auVar42 = auVar29 ^ auVar41;
                  auVar34 = auVar37 ^ auVar41;
                  iVar16 = -(uint)(auVar34._0_4_ < auVar42._0_4_);
                  iVar64 = auVar34._4_4_;
                  auVar48._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
                  iVar57 = -(uint)(auVar34._8_4_ < auVar42._8_4_);
                  iVar66 = auVar34._12_4_;
                  auVar48._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
                  auVar58._4_4_ = iVar16;
                  auVar58._0_4_ = iVar16;
                  auVar58._8_4_ = iVar57;
                  auVar58._12_4_ = iVar57;
                  auVar43._4_4_ = -(uint)(auVar42._4_4_ == iVar64);
                  auVar43._12_4_ = -(uint)(auVar42._12_4_ == iVar66);
                  auVar43._0_4_ = auVar43._4_4_;
                  auVar43._8_4_ = auVar43._12_4_;
                  auVar48._0_4_ = auVar48._4_4_;
                  auVar48._8_4_ = auVar48._12_4_;
                  auVar48 = auVar48 | auVar43 & auVar58;
                  auVar49 = ~auVar48 & auVar37 | auVar29 & auVar48;
                  auVar42 = auVar49 ^ auVar41;
                  auVar44 = auVar75 ^ auVar41;
                  iVar16 = -(uint)(auVar44._0_4_ < auVar42._0_4_);
                  iVar46 = auVar44._4_4_;
                  iVar63 = -(uint)(iVar46 < auVar42._4_4_);
                  iVar57 = -(uint)(auVar44._8_4_ < auVar42._8_4_);
                  iVar47 = auVar44._12_4_;
                  iVar65 = -(uint)(iVar47 < auVar42._12_4_);
                  auVar67._4_4_ = iVar16;
                  auVar67._0_4_ = iVar16;
                  auVar67._8_4_ = iVar57;
                  auVar67._12_4_ = iVar57;
                  iVar16 = -(uint)(auVar42._4_4_ == iVar46);
                  iVar57 = -(uint)(auVar42._12_4_ == iVar47);
                  auVar69._4_4_ = iVar16;
                  auVar69._0_4_ = iVar16;
                  auVar69._8_4_ = iVar57;
                  auVar69._12_4_ = iVar57;
                  auVar30._4_4_ = iVar63;
                  auVar30._0_4_ = iVar63;
                  auVar30._8_4_ = iVar65;
                  auVar30._12_4_ = iVar65;
                  auVar30 = auVar30 | auVar69 & auVar67;
                  auVar42 = ~auVar30 & auVar75 | auVar49 & auVar30;
                  *(undefined1 (*) [16])((long)*ptr + lVar20) = auVar42;
                  auVar59 = auVar42 ^ auVar41;
                  auVar49 = auVar51 ^ auVar41;
                  iVar16 = -(uint)(auVar49._0_4_ < auVar59._0_4_);
                  iVar57 = -(uint)(auVar49._4_4_ < auVar59._4_4_);
                  iVar63 = -(uint)(auVar49._8_4_ < auVar59._8_4_);
                  iVar65 = -(uint)(auVar49._12_4_ < auVar59._12_4_);
                  auVar70._4_4_ = iVar16;
                  auVar70._0_4_ = iVar16;
                  auVar70._8_4_ = iVar63;
                  auVar70._12_4_ = iVar63;
                  auVar50._4_4_ = -(uint)(auVar49._4_4_ == auVar59._4_4_);
                  auVar50._12_4_ = -(uint)(auVar49._12_4_ == auVar59._12_4_);
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar60._4_4_ = iVar57;
                  auVar60._0_4_ = iVar57;
                  auVar60._8_4_ = iVar65;
                  auVar60._12_4_ = iVar65;
                  auVar60 = auVar60 | auVar50 & auVar70;
                  auVar49 = ~auVar60 & auVar42 | auVar51 & auVar60;
                  auVar51 = auVar49 ^ auVar41;
                  iVar16 = -(uint)(auVar51._0_4_ < auVar34._0_4_);
                  iVar63 = -(uint)(auVar51._4_4_ < iVar64);
                  iVar57 = -(uint)(auVar51._8_4_ < auVar34._8_4_);
                  iVar65 = -(uint)(auVar51._12_4_ < iVar66);
                  auVar71._4_4_ = iVar16;
                  auVar71._0_4_ = iVar16;
                  auVar71._8_4_ = iVar57;
                  auVar71._12_4_ = iVar57;
                  iVar16 = -(uint)(auVar51._4_4_ == iVar64);
                  iVar57 = -(uint)(auVar51._12_4_ == iVar66);
                  auVar35._4_4_ = iVar16;
                  auVar35._0_4_ = iVar16;
                  auVar35._8_4_ = iVar57;
                  auVar35._12_4_ = iVar57;
                  auVar52._4_4_ = iVar63;
                  auVar52._0_4_ = iVar63;
                  auVar52._8_4_ = iVar65;
                  auVar52._12_4_ = iVar65;
                  auVar52 = auVar52 | auVar35 & auVar71;
                  auVar34 = ~auVar52 & auVar37 | auVar49 & auVar52;
                  auVar51 = auVar34 ^ auVar41;
                  iVar16 = -(uint)(auVar51._0_4_ < auVar44._0_4_);
                  iVar57 = -(uint)(auVar51._4_4_ < iVar46);
                  iVar64 = -(uint)(auVar51._8_4_ < auVar44._8_4_);
                  iVar66 = -(uint)(auVar51._12_4_ < iVar47);
                  auVar68._4_4_ = iVar16;
                  auVar68._0_4_ = iVar16;
                  auVar68._8_4_ = iVar64;
                  auVar68._12_4_ = iVar64;
                  auVar36._4_4_ = -(uint)(auVar51._4_4_ == iVar46);
                  auVar36._12_4_ = -(uint)(auVar51._12_4_ == iVar47);
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar73._4_4_ = iVar57;
                  auVar73._0_4_ = iVar57;
                  auVar73._8_4_ = iVar66;
                  auVar73._12_4_ = iVar66;
                  auVar73 = auVar73 | auVar36 & auVar68;
                  auVar51 = ~auVar73 & auVar75 | auVar34 & auVar73;
                  piVar4 = ((ppVar8->field_4).rowcols)->score_row;
                  *(int *)((long)piVar4 + lVar17) = auVar42._0_4_;
                  lVar18 = (long)piVar4 + lVar17;
                  *(int *)(lVar10 + lVar18) = auVar42._8_4_;
                  auVar31._0_8_ = auVar42._0_8_ - uVar13;
                  auVar31._8_8_ = auVar42._8_8_ - (ulong)(uint)open;
                  auVar49._0_8_ = auVar37._0_8_ - uVar72;
                  auVar49._8_8_ = auVar37._8_8_ - uVar19;
                  auVar37 = auVar49 ^ auVar41;
                  auVar42 = auVar31 ^ auVar41;
                  iVar16 = -(uint)(auVar42._0_4_ < auVar37._0_4_);
                  iVar64 = auVar42._4_4_;
                  auVar53._4_4_ = -(uint)(iVar64 < auVar37._4_4_);
                  iVar57 = -(uint)(auVar42._8_4_ < auVar37._8_4_);
                  iVar66 = auVar42._12_4_;
                  auVar53._12_4_ = -(uint)(iVar66 < auVar37._12_4_);
                  auVar61._4_4_ = iVar16;
                  auVar61._0_4_ = iVar16;
                  auVar61._8_4_ = iVar57;
                  auVar61._12_4_ = iVar57;
                  auVar38._4_4_ = -(uint)(auVar37._4_4_ == iVar64);
                  auVar38._12_4_ = -(uint)(auVar37._12_4_ == iVar66);
                  auVar38._0_4_ = auVar38._4_4_;
                  auVar38._8_4_ = auVar38._12_4_;
                  auVar53._0_4_ = auVar53._4_4_;
                  auVar53._8_4_ = auVar53._12_4_;
                  auVar53 = auVar53 | auVar38 & auVar61;
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar20) =
                       ~auVar53 & auVar31 | auVar49 & auVar53;
                  auVar74._0_8_ = auVar75._0_8_ - uVar72;
                  auVar74._8_8_ = auVar75._8_8_ - uVar19;
                  auVar37 = auVar74 ^ auVar41;
                  iVar16 = -(uint)(auVar42._0_4_ < auVar37._0_4_);
                  auVar39._4_4_ = -(uint)(iVar64 < auVar37._4_4_);
                  iVar57 = -(uint)(auVar42._8_4_ < auVar37._8_4_);
                  auVar39._12_4_ = -(uint)(iVar66 < auVar37._12_4_);
                  auVar54._4_4_ = iVar16;
                  auVar54._0_4_ = iVar16;
                  auVar54._8_4_ = iVar57;
                  auVar54._12_4_ = iVar57;
                  auVar59._4_4_ = -(uint)(auVar37._4_4_ == iVar64);
                  auVar59._12_4_ = -(uint)(auVar37._12_4_ == iVar66);
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  auVar39._0_4_ = auVar39._4_4_;
                  auVar39._8_4_ = auVar39._12_4_;
                  auVar39 = auVar39 | auVar59 & auVar54;
                  auVar75 = auVar74 & auVar39 | ~auVar39 & auVar31;
                  plVar1 = (long *)((long)*ptr_02 + lVar20);
                  iVar28 = *plVar1;
                  lVar33 = plVar1[1];
                  lVar17 = lVar17 + uVar22 * 4;
                }
                for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
                  lVar17 = ptr_01[uVar11 + 1] - uVar13;
                  lVar20 = auVar75._0_8_;
                  lVar21 = local_138;
                  lVar14 = 0;
                  while( true ) {
                    uStack_13c = (undefined4)((ulong)lVar20 >> 0x20);
                    uStack_140 = (undefined4)lVar20;
                    if (size * 0x10 + 0x10 == lVar14 + 0x10) break;
                    auVar37 = *(undefined1 (*) [16])((long)*ptr + lVar14);
                    auVar5._8_4_ = uStack_140;
                    auVar5._0_8_ = lVar17;
                    auVar5._12_4_ = uStack_13c;
                    auVar42 = auVar5 ^ auVar41;
                    auVar34 = auVar37 ^ auVar41;
                    iVar16 = -(uint)(auVar42._0_4_ < auVar34._0_4_);
                    iVar57 = -(uint)(auVar42._4_4_ < auVar34._4_4_);
                    iVar64 = -(uint)(auVar42._8_4_ < auVar34._8_4_);
                    iVar66 = -(uint)(auVar42._12_4_ < auVar34._12_4_);
                    auVar55._4_4_ = iVar16;
                    auVar55._0_4_ = iVar16;
                    auVar55._8_4_ = iVar64;
                    auVar55._12_4_ = iVar64;
                    auVar40._4_4_ = -(uint)(auVar34._4_4_ == auVar42._4_4_);
                    auVar40._12_4_ = -(uint)(auVar34._12_4_ == auVar42._12_4_);
                    auVar40._0_4_ = auVar40._4_4_;
                    auVar40._8_4_ = auVar40._12_4_;
                    auVar32._4_4_ = iVar57;
                    auVar32._0_4_ = iVar57;
                    auVar32._8_4_ = iVar66;
                    auVar32._12_4_ = iVar66;
                    auVar32 = auVar32 | auVar40 & auVar55;
                    auVar37 = ~auVar32 & auVar5 | auVar37 & auVar32;
                    *(undefined1 (*) [16])((long)*ptr + lVar14) = auVar37;
                    auVar42 = auVar51 ^ auVar41;
                    auVar41 = auVar37 ^ auVar41;
                    iVar16 = -(uint)(auVar42._0_4_ < auVar41._0_4_);
                    auVar45._4_4_ = -(uint)(auVar42._4_4_ < auVar41._4_4_);
                    iVar57 = -(uint)(auVar42._8_4_ < auVar41._8_4_);
                    auVar45._12_4_ = -(uint)(auVar42._12_4_ < auVar41._12_4_);
                    auVar56._4_4_ = iVar16;
                    auVar56._0_4_ = iVar16;
                    auVar56._8_4_ = iVar57;
                    auVar56._12_4_ = iVar57;
                    auVar62._4_4_ = -(uint)(auVar42._4_4_ == auVar41._4_4_);
                    auVar62._12_4_ = -(uint)(auVar42._12_4_ == auVar41._12_4_);
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar45._0_4_ = auVar45._4_4_;
                    auVar45._8_4_ = auVar45._12_4_;
                    auVar45 = auVar45 | auVar62 & auVar56;
                    auVar51 = auVar51 & auVar45 | ~auVar45 & auVar37;
                    piVar4 = ((ppVar8->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar21) = auVar37._0_4_;
                    *(int *)(lVar10 + (long)piVar4 + lVar21) = auVar37._8_4_;
                    lVar17 = lVar17 - uVar72;
                    lVar20 = auVar5._8_8_ - uVar19;
                    a[1] = lVar18;
                    a[0] = (longlong)ppVar8;
                    b[1] = (longlong)piVar4;
                    b[0] = (long)piVar4 + lVar21;
                    _mm_cmpgt_epi64_rpl(a,b);
                    lVar21 = lVar21 + uVar22 * 4;
                    lVar14 = lVar14 + 0x10;
                    auVar41 = _DAT_008a1890;
                    if ((((((((((((((((extraout_XMM0 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (extraout_XMM0 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (extraout_XMM0 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (extraout_XMM0 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (extraout_XMM0 >> 0x27 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (extraout_XMM0 >> 0x2f & (undefined1  [16])0x1) ==
                                 (undefined1  [16])0x0) &&
                                (extraout_XMM0 >> 0x37 & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0) &&
                               (extraout_XMM0 >> 0x3f & (undefined1  [16])0x1) ==
                               (undefined1  [16])0x0) &&
                              (extraout_XMM0 >> 0x47 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) &&
                             (extraout_XMM0 >> 0x4f & (undefined1  [16])0x1) ==
                             (undefined1  [16])0x0) &&
                            (extraout_XMM0 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                            ) && (extraout_XMM0 >> 0x5f & (undefined1  [16])0x1) ==
                                 (undefined1  [16])0x0) &&
                          (extraout_XMM0 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                         && (extraout_XMM0 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                         ) && (extraout_XMM0 >> 0x77 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) && -1 < extraout_XMM0[0xf]) goto LAB_005618b1;
                  }
                  auVar75._8_4_ = uStack_140;
                  auVar75._0_8_ = lVar17;
                  auVar75._12_4_ = uStack_13c;
                }
LAB_005618b1:
                uVar11 = uVar11 + 1;
                local_138 = local_138 + 4;
                palVar9 = ptr;
                ptr = ptr_02;
              } while( true );
            }
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse2_128_64",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}